

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

function_map * skiwi::generate_function_map_abi_cxx11_(void)

{
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  *in_RDI;
  _func_void_asmcode_ptr_compiler_options_ptr *local_40;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_38;
  
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
    **)(in_RDI + 0x18) = in_RDI + 8;
  *(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
    **)(in_RDI + 0x20) = in_RDI + 8;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  local_40 = compile_add;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[2],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [2])0x25a107,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_sub;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[2],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [2])0x25a119,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_mul;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[2],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [2])0x25a10d,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_div;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[2],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [2])0x25a113,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_equal;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[2],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [2])0x259ac9,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_not_equal;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[3],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [3])"!=",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_less;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[2],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [2])"<",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_leq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[3],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [3])"<=",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_greater;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[2],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [2])0x2602d1,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_geq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[3],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [3])">=",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_allocate_symbol;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[17],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [17])"%allocate-symbol",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_slot_ref;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[10],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [10])"%slot-ref",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_slot_set;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [11])"%slot-set!",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_undefined;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [11])0x259db5,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_skiwi_quiet_undefined;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[17],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [17])0x259dc2,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_add1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [5])0x25a0db,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_apply;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [7])"%apply",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_arithmetic_shift;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[17],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [17])0x259da2,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_assoc;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [6])"assoc",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_assq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [5])0x25a02c,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_assv;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [5])"assv",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_bitwise_and;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [12])0x259e54,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_bitwise_not;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [12])0x259e62,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_bitwise_or;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [11])0x259e70,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_bitwise_xor;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [12])0x259e7d,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_is_boolean;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[9],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [9])0x25a19c,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_car;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[4],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [4])0x25a040,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_cdr;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[4],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [4])0x25a046,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_is_char;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [6])0x25a1bd,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_char_equal;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [7])0x259e4b,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_char_less;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [7])0x259e25,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_char_greater;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [7])0x259e38,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_char_leq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [8])0x259e2e,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_char_geq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [8])0x259e41,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_char_to_fixnum;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[13],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [13])0x259e16,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_close_file;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [11])"close-file",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_closure;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [8])"closure",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_is_closure;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[9],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [9])0x25a184,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_closure_ref;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [12])"closure-ref",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_cons;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [5])0x25a039,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_compare_strings;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[16],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [16])"compare-strings",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_compare_strings_ci;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[19],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [19])"compare-strings-ci",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_current_seconds;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[16],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [16])"current-seconds",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_current_milliseconds;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[21],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [21])"current-milliseconds",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_is_eof_object;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [12])0x25a1af,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_is_eq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[4],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [4])0x25a062,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_is_eqv;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [5])0x259b5f,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_is_eqv_structurally;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [6])"%eqv?",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_is_equal;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [7])"equal?",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_error;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [7])"%error",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_eval;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [6])"%eval",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_file_exists;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[13],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [13])"file-exists?",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_is_fixnum;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [8])0x25a14a,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_fixnum_to_char;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[13],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [13])0x259e07,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_fixnum_to_flonum;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[15],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [15])0x259de5,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_fixnum_expt;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [12])"fixnum-expt",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_is_flonum;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [8])0x25a154,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_flonum_to_fixnum;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[15],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [15])0x259df6,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_flonum_expt;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [12])"flonum-expt",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_flush_output_port;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[19],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [19])"%flush-output-port",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_fx_equal;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [5])0x25a0ca,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_fx_less;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [5])0x25a0ac,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_fx_greater;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [5])0x25a0bb,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_fx_leq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [6])0x25a0b3,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_fx_geq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [6])0x25a0c2,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_fx_add;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[4],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [4])0x25a094,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_fx_sub;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[4],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [4])0x25a09a,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_fx_mul;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[4],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [4])0x25a0a0,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_fx_div;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[4],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [4])0x25a0a6,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_fx_add1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [7])0x25a068,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_fx_sub1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [7])0x25a071,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_fx_is_zero;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [8])0x25a08a,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_getenv;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [7])0x262e87,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_halt;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [5])"halt",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_ieee754_sign;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[13],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [13])0x259e8b,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_ieee754_exponent;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[17],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [17])0x259ead,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_ieee754_mantissa;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[17],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [17])0x259e9a,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_ieee754_sin;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [12])"ieee754-sin",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_ieee754_cos;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [12])"ieee754-cos",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_ieee754_tan;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [12])"ieee754-tan",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_ieee754_asin;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[13],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [13])"ieee754-asin",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_ieee754_acos;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[13],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [13])"ieee754-acos",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_ieee754_atan1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[14],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [14])"ieee754-atan1",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_ieee754_log;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [12])"ieee754-log",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_ieee754_round;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[14],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [14])"ieee754-round",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_ieee754_sqrt;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[13],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [13])"ieee754-sqrt",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_ieee754_truncate;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[17],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [17])"ieee754-truncate",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_ieee754_pi;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [11])0x259ec0,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_is_input_port;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [12])0x25a1d8,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_load;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [5])0x25f38b,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_length;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [7])0x259ce8,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_list;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [5])0x25f2cb,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_make_port;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[10],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [10])"make-port",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_make_promise;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[14],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [14])"%make-promise",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_make_string;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [12])"make-string",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_make_vector;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [12])"make-vector",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_max;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[4],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [4])0x25a0ed,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_member;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [7])"member",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_memq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [5])0x25a025,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_memv;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [5])"memv",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_min;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[4],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [4])0x25a0f5,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_not;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[4],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [4])0x25a033,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_is_nil;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [6])0x25a1a7,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_num2str;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [8])"num2str",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_open_file;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[10],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [10])"open-file",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_is_output_port;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[13],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [13])0x25a1e6,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_peek_char;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [11])"%peek-char",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_is_pair;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [6])0x25a15e,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_is_port;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [6])0x25a1d0,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_is_procedure;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [11])0x25a18f,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_is_promise;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[9],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [9])0x25a1c5,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_putenv;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [7])0x262e95,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_quotient;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[9],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [9])0x259d97,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_read_char;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [11])"%read-char",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_reclaim;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [8])"reclaim",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_reclaim_garbage;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[16],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [16])0x25a50f,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_remainder;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[10],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [10])0x259d8b,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_set_car;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[9],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [9])0x25a04c,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_set_cdr;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[9],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [9])0x25a057,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_str2num;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [8])"str2num",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_string;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [7])0x25f27f,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_string_hash;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [12])"string-hash",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_is_string;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [8])0x25a170,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_string_append1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[15],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [15])"string-append1",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_string_copy;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [12])"string-copy",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_string_fill;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[13],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [13])"string-fill!",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_string_length;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[14],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [14])"string-length",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_string_ref;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [11])"string-ref",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_string_set;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [12])"string-set!",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_substring;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[10],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [10])"substring",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_symbol_to_string;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[15],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [15])"symbol->string",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_is_symbol;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [8])0x25a17a,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_sub1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [5])0x25a0e4,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_vector;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [7])0x25f299,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_is_vector;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [8])0x25a166,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_vector_fill;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[13],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [13])"vector-fill!",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_vector_length;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[14],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [14])0x259dd5,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_vector_ref;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [11])"vector-ref",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_vector_set;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [12])"vector-set!",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_write_char;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [12])"%write-char",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_write_string;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[14],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [14])"%write-string",&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = compile_is_zero;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_38,(char (*) [6])0x25a0fd,&local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (function_map *)in_RDI;
}

Assistant:

function_map generate_function_map()
  {
  function_map fm;
  fm.insert(std::pair<std::string, fun_ptr>("+", &compile_add));
  fm.insert(std::pair<std::string, fun_ptr>("-", &compile_sub));
  fm.insert(std::pair<std::string, fun_ptr>("*", &compile_mul));
  fm.insert(std::pair<std::string, fun_ptr>("/", &compile_div));
  fm.insert(std::pair<std::string, fun_ptr>("=", &compile_equal));
  fm.insert(std::pair<std::string, fun_ptr>("!=", &compile_not_equal));
  fm.insert(std::pair<std::string, fun_ptr>("<", &compile_less));
  fm.insert(std::pair<std::string, fun_ptr>("<=", &compile_leq));
  fm.insert(std::pair<std::string, fun_ptr>(">", &compile_greater));
  fm.insert(std::pair<std::string, fun_ptr>(">=", &compile_geq));
  fm.insert(std::pair<std::string, fun_ptr>("%allocate-symbol", &compile_allocate_symbol));
  fm.insert(std::pair<std::string, fun_ptr>("%slot-ref", &compile_slot_ref));
  fm.insert(std::pair<std::string, fun_ptr>("%slot-set!", &compile_slot_set));
  fm.insert(std::pair<std::string, fun_ptr>("%undefined", &compile_undefined));
  fm.insert(std::pair<std::string, fun_ptr>("%quiet-undefined", &compile_skiwi_quiet_undefined));
  fm.insert(std::pair<std::string, fun_ptr>("add1", &compile_add1));
  fm.insert(std::pair<std::string, fun_ptr>("%apply", &compile_apply));
  fm.insert(std::pair<std::string, fun_ptr>("arithmetic-shift", &compile_arithmetic_shift));
  fm.insert(std::pair<std::string, fun_ptr>("assoc", &compile_assoc));
  fm.insert(std::pair<std::string, fun_ptr>("assq", &compile_assq));
  fm.insert(std::pair<std::string, fun_ptr>("assv", &compile_assv));
  fm.insert(std::pair<std::string, fun_ptr>("bitwise-and", &compile_bitwise_and));
  fm.insert(std::pair<std::string, fun_ptr>("bitwise-not", &compile_bitwise_not));
  fm.insert(std::pair<std::string, fun_ptr>("bitwise-or", &compile_bitwise_or));
  fm.insert(std::pair<std::string, fun_ptr>("bitwise-xor", &compile_bitwise_xor));
  fm.insert(std::pair<std::string, fun_ptr>("boolean?", &compile_is_boolean));
  fm.insert(std::pair<std::string, fun_ptr>("car", &compile_car));
  fm.insert(std::pair<std::string, fun_ptr>("cdr", &compile_cdr));
  fm.insert(std::pair<std::string, fun_ptr>("char?", &compile_is_char));
  fm.insert(std::pair<std::string, fun_ptr>("char=?", &compile_char_equal));
  fm.insert(std::pair<std::string, fun_ptr>("char<?", &compile_char_less));
  fm.insert(std::pair<std::string, fun_ptr>("char>?", &compile_char_greater));
  fm.insert(std::pair<std::string, fun_ptr>("char<=?", &compile_char_leq));
  fm.insert(std::pair<std::string, fun_ptr>("char>=?", &compile_char_geq));
  fm.insert(std::pair<std::string, fun_ptr>("char->fixnum", &compile_char_to_fixnum));
  fm.insert(std::pair<std::string, fun_ptr>("close-file", &compile_close_file));
  fm.insert(std::pair<std::string, fun_ptr>("closure", &compile_closure));
  fm.insert(std::pair<std::string, fun_ptr>("closure?", &compile_is_closure));
  fm.insert(std::pair<std::string, fun_ptr>("closure-ref", &compile_closure_ref));
  fm.insert(std::pair<std::string, fun_ptr>("cons", &compile_cons));
  fm.insert(std::pair<std::string, fun_ptr>("compare-strings", &compile_compare_strings));
  fm.insert(std::pair<std::string, fun_ptr>("compare-strings-ci", &compile_compare_strings_ci));
  fm.insert(std::pair<std::string, fun_ptr>("current-seconds", &compile_current_seconds));
  fm.insert(std::pair<std::string, fun_ptr>("current-milliseconds", &compile_current_milliseconds));
  fm.insert(std::pair<std::string, fun_ptr>("eof-object?", &compile_is_eof_object));
  fm.insert(std::pair<std::string, fun_ptr>("eq?", &compile_is_eq));
  fm.insert(std::pair<std::string, fun_ptr>("eqv?", &compile_is_eqv));
  fm.insert(std::pair<std::string, fun_ptr>("%eqv?", &compile_is_eqv_structurally));
  fm.insert(std::pair<std::string, fun_ptr>("equal?", &compile_is_equal));
  fm.insert(std::pair<std::string, fun_ptr>("%error", &compile_error));
  fm.insert(std::pair<std::string, fun_ptr>("%eval", &compile_eval));
  fm.insert(std::pair<std::string, fun_ptr>("file-exists?", &compile_file_exists));
  fm.insert(std::pair<std::string, fun_ptr>("fixnum?", &compile_is_fixnum));
  fm.insert(std::pair<std::string, fun_ptr>("fixnum->char", &compile_fixnum_to_char));
  fm.insert(std::pair<std::string, fun_ptr>("fixnum->flonum", &compile_fixnum_to_flonum));
  fm.insert(std::pair<std::string, fun_ptr>("fixnum-expt", &compile_fixnum_expt));
  fm.insert(std::pair<std::string, fun_ptr>("flonum?", &compile_is_flonum));
  fm.insert(std::pair<std::string, fun_ptr>("flonum->fixnum", &compile_flonum_to_fixnum));
  fm.insert(std::pair<std::string, fun_ptr>("flonum-expt", &compile_flonum_expt));
  fm.insert(std::pair<std::string, fun_ptr>("%flush-output-port", &compile_flush_output_port));
  fm.insert(std::pair<std::string, fun_ptr>("fx=?", &compile_fx_equal));
  fm.insert(std::pair<std::string, fun_ptr>("fx<?", &compile_fx_less));
  fm.insert(std::pair<std::string, fun_ptr>("fx>?", &compile_fx_greater));
  fm.insert(std::pair<std::string, fun_ptr>("fx<=?", &compile_fx_leq));
  fm.insert(std::pair<std::string, fun_ptr>("fx>=?", &compile_fx_geq));
  fm.insert(std::pair<std::string, fun_ptr>("fx+", &compile_fx_add));
  fm.insert(std::pair<std::string, fun_ptr>("fx-", &compile_fx_sub));
  fm.insert(std::pair<std::string, fun_ptr>("fx*", &compile_fx_mul));
  fm.insert(std::pair<std::string, fun_ptr>("fx/", &compile_fx_div));
  fm.insert(std::pair<std::string, fun_ptr>("fxadd1", &compile_fx_add1));
  fm.insert(std::pair<std::string, fun_ptr>("fxsub1", &compile_fx_sub1));
  fm.insert(std::pair<std::string, fun_ptr>("fxzero?", &compile_fx_is_zero));
  fm.insert(std::pair<std::string, fun_ptr>("getenv", &compile_getenv));
  fm.insert(std::pair<std::string, fun_ptr>("halt", &compile_halt));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-sign", &compile_ieee754_sign));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-exponent", &compile_ieee754_exponent));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-mantissa", &compile_ieee754_mantissa));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-sin", &compile_ieee754_sin));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-cos", &compile_ieee754_cos));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-tan", &compile_ieee754_tan));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-asin", &compile_ieee754_asin));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-acos", &compile_ieee754_acos));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-atan1", &compile_ieee754_atan1));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-log", &compile_ieee754_log));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-round", &compile_ieee754_round));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-sqrt", &compile_ieee754_sqrt));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-truncate", &compile_ieee754_truncate));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-pi", &compile_ieee754_pi));
  fm.insert(std::pair<std::string, fun_ptr>("input-port?", &compile_is_input_port));
  fm.insert(std::pair<std::string, fun_ptr>("load", &compile_load));
  fm.insert(std::pair<std::string, fun_ptr>("length", &compile_length));
  fm.insert(std::pair<std::string, fun_ptr>("list", &compile_list));
  fm.insert(std::pair<std::string, fun_ptr>("make-port", &compile_make_port));
  fm.insert(std::pair<std::string, fun_ptr>("%make-promise", &compile_make_promise));
  fm.insert(std::pair<std::string, fun_ptr>("make-string", &compile_make_string));
  fm.insert(std::pair<std::string, fun_ptr>("make-vector", &compile_make_vector));
  fm.insert(std::pair<std::string, fun_ptr>("max", &compile_max));
  fm.insert(std::pair<std::string, fun_ptr>("member", &compile_member));
  fm.insert(std::pair<std::string, fun_ptr>("memq", &compile_memq));
  fm.insert(std::pair<std::string, fun_ptr>("memv", &compile_memv));
  fm.insert(std::pair<std::string, fun_ptr>("min", &compile_min));
  fm.insert(std::pair<std::string, fun_ptr>("not", &compile_not));
  fm.insert(std::pair<std::string, fun_ptr>("null?", &compile_is_nil));
  fm.insert(std::pair<std::string, fun_ptr>("num2str", &compile_num2str));
  fm.insert(std::pair<std::string, fun_ptr>("open-file", &compile_open_file));
  fm.insert(std::pair<std::string, fun_ptr>("output-port?", &compile_is_output_port));
  fm.insert(std::pair<std::string, fun_ptr>("%peek-char", &compile_peek_char));
  fm.insert(std::pair<std::string, fun_ptr>("pair?", &compile_is_pair));
  fm.insert(std::pair<std::string, fun_ptr>("port?", &compile_is_port));
  fm.insert(std::pair<std::string, fun_ptr>("procedure?", &compile_is_procedure));
  fm.insert(std::pair<std::string, fun_ptr>("promise?", &compile_is_promise));
  fm.insert(std::pair<std::string, fun_ptr>("putenv", &compile_putenv));
  fm.insert(std::pair<std::string, fun_ptr>("quotient", &compile_quotient));
  fm.insert(std::pair<std::string, fun_ptr>("%read-char", &compile_read_char));
  fm.insert(std::pair<std::string, fun_ptr>("reclaim", &compile_reclaim));
  fm.insert(std::pair<std::string, fun_ptr>("reclaim-garbage", &compile_reclaim_garbage));
  fm.insert(std::pair<std::string, fun_ptr>("remainder", &compile_remainder));
  fm.insert(std::pair<std::string, fun_ptr>("set-car!", &compile_set_car));
  fm.insert(std::pair<std::string, fun_ptr>("set-cdr!", &compile_set_cdr));
  fm.insert(std::pair<std::string, fun_ptr>("str2num", &compile_str2num));
  fm.insert(std::pair<std::string, fun_ptr>("string", &compile_string));
  fm.insert(std::pair<std::string, fun_ptr>("string-hash", &compile_string_hash));
  fm.insert(std::pair<std::string, fun_ptr>("string?", &compile_is_string));
  fm.insert(std::pair<std::string, fun_ptr>("string-append1", &compile_string_append1));
  fm.insert(std::pair<std::string, fun_ptr>("string-copy", &compile_string_copy));
  fm.insert(std::pair<std::string, fun_ptr>("string-fill!", &compile_string_fill));
  fm.insert(std::pair<std::string, fun_ptr>("string-length", &compile_string_length));
  fm.insert(std::pair<std::string, fun_ptr>("string-ref", &compile_string_ref));
  fm.insert(std::pair<std::string, fun_ptr>("string-set!", &compile_string_set));
  fm.insert(std::pair<std::string, fun_ptr>("substring", &compile_substring));
  fm.insert(std::pair<std::string, fun_ptr>("symbol->string", &compile_symbol_to_string));
  fm.insert(std::pair<std::string, fun_ptr>("symbol?", &compile_is_symbol));
  fm.insert(std::pair<std::string, fun_ptr>("sub1", &compile_sub1));
  fm.insert(std::pair<std::string, fun_ptr>("vector", &compile_vector));
  fm.insert(std::pair<std::string, fun_ptr>("vector?", &compile_is_vector));
  fm.insert(std::pair<std::string, fun_ptr>("vector-fill!", &compile_vector_fill));
  fm.insert(std::pair<std::string, fun_ptr>("vector-length", &compile_vector_length));
  fm.insert(std::pair<std::string, fun_ptr>("vector-ref", &compile_vector_ref));
  fm.insert(std::pair<std::string, fun_ptr>("vector-set!", &compile_vector_set));
  fm.insert(std::pair<std::string, fun_ptr>("%write-char", &compile_write_char));
  fm.insert(std::pair<std::string, fun_ptr>("%write-string", &compile_write_string));
  fm.insert(std::pair<std::string, fun_ptr>("zero?", &compile_is_zero));
  return fm;
  }